

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O1

int vrna_nucleotide_IUPAC_identity(char nt,char mask)

{
  __int32_t **pp_Var1;
  void *pvVar2;
  size_t __n;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  char *__s;
  
  pp_Var1 = __ctype_toupper_loc();
  pvVar2 = (void *)0x0;
  switch((char)(*pp_Var1)[(int)CONCAT71(in_register_00000039,nt)]) {
  case 'A':
    __s = "ARMWDHVN";
    break;
  case 'B':
    __s = "GCTBU";
    goto LAB_0012afe9;
  case 'C':
    __s = "CYMSBHVN";
    break;
  case 'D':
    __s = "AGTUD";
    goto LAB_0012afe9;
  default:
    goto switchD_0012af7a_caseD_45;
  case 'G':
    __s = "GRKSBDVN";
    break;
  case 'H':
    __s = "ACTUH";
LAB_0012afe9:
    __n = 6;
    goto LAB_0012b067;
  case 'I':
    __s = "IN";
    __n = 3;
    goto LAB_0012b067;
  case 'K':
    __s = "GTUK";
    goto LAB_0012b062;
  case 'M':
    __s = "ACM";
    goto LAB_0012b051;
  case 'N':
    __s = "ACGTUN";
    __n = 7;
    goto LAB_0012b067;
  case 'R':
    __s = "AGR";
    goto LAB_0012b051;
  case 'S':
    __s = "GCS";
LAB_0012b051:
    __n = 4;
    goto LAB_0012b067;
  case 'T':
    __s = "TYKWBDHN";
    break;
  case 'U':
    __s = "UYKWBDHN";
    break;
  case 'V':
    __s = "ACGV";
    goto LAB_0012b062;
  case 'W':
    __s = "ATUW";
    goto LAB_0012b062;
  case 'Y':
    __s = "CTUY";
LAB_0012b062:
    __n = 5;
    goto LAB_0012b067;
  }
  __n = 9;
LAB_0012b067:
  pvVar2 = memchr(__s,(int)(char)(*pp_Var1)[(int)CONCAT71(in_register_00000031,mask)],__n);
switchD_0012af7a_caseD_45:
  return (int)(pvVar2 != (void *)0x0);
}

Assistant:

PUBLIC int
vrna_nucleotide_IUPAC_identity(char nt,
                               char mask)
{
  char n1, n2, *p;

  p   = NULL;
  n1  = toupper(nt);
  n2  = toupper(mask);

  switch (n1) {
    case 'A':
      p = strchr("ARMWDHVN", n2);
      break;
    case 'C':
      p = strchr("CYMSBHVN", n2);
      break;
    case 'G':
      p = strchr("GRKSBDVN", n2);
      break;
    case 'T':
      p = strchr("TYKWBDHN", n2);
      break;
    case 'U':
      p = strchr("UYKWBDHN", n2);
      break;
    case 'I':
      p = strchr("IN", n2);
      break;
    case 'R':
      p = strchr("AGR", n2);
      break;
    case 'Y':
      p = strchr("CTUY", n2);
      break;
    case 'K':
      p = strchr("GTUK", n2);
      break;
    case 'M':
      p = strchr("ACM", n2);
      break;
    case 'S':
      p = strchr("GCS", n2);
      break;
    case 'W':
      p = strchr("ATUW", n2);
      break;
    case 'B':
      p = strchr("GCTBU", n2);
      break;
    case 'D':
      p = strchr("AGTUD", n2);
      break;
    case 'H':
      p = strchr("ACTUH", n2);
      break;
    case 'V':
      p = strchr("ACGV", n2);
      break;
    case 'N':
      p = strchr("ACGTUN", n2);
      break;
  }

  return (p) ? 1 : 0;
}